

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O0

string * __thiscall Assimp::FIHexValueImpl::toString_abi_cxx11_(FIHexValueImpl *this)

{
  void *this_00;
  undefined8 uVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_01;
  string local_1d8 [32];
  ostringstream *local_1b8;
  ostringstream *local_1b0;
  uchar *local_1a8;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1a0;
  char local_195;
  ostringstream local_188 [8];
  ostringstream os;
  FIHexValueImpl *this_local;
  
  if ((this->strValueValid & 1U) == 0) {
    this->strValueValid = true;
    std::__cxx11::ostringstream::ostringstream(local_188);
    this_00 = (void *)std::ostream::operator<<(local_188,std::hex);
    uVar1 = std::ostream::operator<<(this_00,std::uppercase);
    local_195 = (char)std::setfill<char>('0');
    std::operator<<(uVar1,local_195);
    this_01 = &(this->super_FIHexValue).super_FIByteValue.value;
    local_1a0._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(this_01);
    local_1a8 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(this_01);
    local_1b0 = (ostringstream *)local_188;
    local_1b8 = (ostringstream *)
                std::
                for_each<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,Assimp::FIHexValueImpl::toString[abi:cxx11]()const::_lambda(unsigned_char)_1_>
                          (local_1a0,
                           (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            )local_1a8,(anon_class_8_1_3fcf66a2)local_1b0);
    std::__cxx11::ostringstream::str();
    std::__cxx11::string::operator=((string *)&this->strValue,local_1d8);
    std::__cxx11::string::~string(local_1d8);
    std::__cxx11::ostringstream::~ostringstream(local_188);
  }
  return &this->strValue;
}

Assistant:

virtual const std::string &toString() const /*override*/ {
        if (!strValueValid) {
            strValueValid = true;
            std::ostringstream os;
            os << std::hex << std::uppercase << std::setfill('0');
            std::for_each(value.begin(), value.end(), [&](uint8_t c) { os << std::setw(2) << static_cast<int>(c); });
            strValue = os.str();
        }
        return strValue;
    }